

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O3

void test_match<std::__cxx11::string,booster::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b_00;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b_01;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b_02;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b_03;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  uint uVar7;
  value_type r_18;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cm;
  value_type r_19;
  ostringstream oss;
  value_type r_11;
  value_type r_9;
  value_type r_7;
  value_type r_17;
  value_type r_14;
  string_type local_2f8;
  smatch local_2d8;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [12];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_80;
  undefined1 local_78;
  undefined7 uStack_77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_2d8.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.begin_._M_current = (char *)0x0;
  local_2d8.end_._M_current = (char *)0x0;
  local_2d8.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar2 = &local_288[0].field_2;
  local_288[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"(a)(a)(x)?(b)","");
  booster::regex::regex((regex *)&local_2f8,(string *)local_288,0);
  bVar3 = booster::regex_match<booster::regex>(str,&local_2d8,(regex *)&local_2f8,0);
  booster::regex::~regex((regex *)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x49);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," booster::regex_match(str,cm,booster::regex(\"(a)(a)(x)?(b)\"))",0x3d);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start != 0x28) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm.size()==5",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((((long)(local_2d8.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->first == -1) ||
       (local_2d8.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start[1].first == -1)) ||
      (local_2d8.offsets_.
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start[3].first != -1)) ||
     (local_2d8.offsets_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start[4].first == -1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               " cm[0].matched && cm[1].matched && cm[1].matched && !cm[3].matched && cm[4].matched"
               ,0x53);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0].field_2._M_local_buf[0] = '\x01';
  local_288[0]._M_dataplus._M_p =
       local_2d8.begin_._M_current +
       (local_2d8.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start)->first;
  local_288[0]._M_string_length =
       (size_type)
       (local_2d8.begin_._M_current +
       (local_2d8.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start)->second);
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"aab");
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[0]==\"aab\"",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"a");
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[1]==\"a\"",0xb);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((2 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[2].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[2].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[2].second);
  }
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"a");
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[2]==\"a\"",0xb);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((3 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[3].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[3].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[3].second);
  }
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"a");
  if (iVar4 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[3]!=\"a\"",0xb);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((3 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[3].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[3].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[3].second);
  }
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"");
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[3]==\"\"",10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((4 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[4].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].second);
  }
  iVar4 = booster::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::compare((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,"b");
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[4]==\"b\"",0xb);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = false;
  iVar4 = (int)((ulong)((long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2d8.offsets_.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar4 < 2) {
    local_c8._M_current = (char *)0x0;
    _Stack_c0._M_current = (char *)0x0;
    local_b8 = 0;
  }
  else {
    local_288[0].field_2._0_1_ =
         (long)local_2d8.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[1].first != -1;
    if ((bool)local_288[0].field_2._0_1_) {
      local_288[0]._M_dataplus._M_p =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].first;
      local_288[0]._M_string_length =
           (size_type)
           (local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].second);
    }
    local_c8._M_current = (char *)0x0;
    _Stack_c0._M_current = (char *)0x0;
    local_b8 = 0;
    if ((iVar4 != 2) &&
       ((long)local_2d8.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[2].first != -1)) {
      local_b8 = 1;
      local_c8._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[2].first;
      _Stack_c0._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[2].second;
    }
  }
  b._17_7_ = uStack_b7;
  b.matched = (bool)local_b8;
  b.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = _Stack_c0._M_current;
  b.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_c8._M_current;
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,b);
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = false;
  uVar7 = (uint)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar7 < 2) {
    local_e8._M_current = (char *)0x0;
    _Stack_e0._M_current = (char *)0x0;
    local_d8 = 0;
  }
  else {
    local_288[0].field_2._0_1_ =
         (long)local_2d8.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[1].first != -1;
    if ((bool)local_288[0].field_2._0_1_) {
      local_288[0]._M_dataplus._M_p =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].first;
      local_288[0]._M_string_length =
           (size_type)
           (local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].second);
    }
    local_e8._M_current = (char *)0x0;
    _Stack_e0._M_current = (char *)0x0;
    local_d8 = 0;
    if ((4 < uVar7) &&
       ((long)local_2d8.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[4].first != -1)) {
      local_d8 = 1;
      local_e8._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[4].first;
      _Stack_e0._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[4].second;
    }
  }
  b_00._17_7_ = uStack_d7;
  b_00.matched = (bool)local_d8;
  b_00.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = _Stack_e0._M_current;
  b_00.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_e8._M_current;
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,b_00);
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = false;
  iVar4 = (int)((ulong)((long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2d8.offsets_.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar4 < 4) {
    local_108._M_current = (char *)0x0;
    _Stack_100._M_current = (char *)0x0;
    local_f8 = 0;
    if (iVar4 < 2) goto LAB_0010a99f;
  }
  else {
    local_288[0].field_2._0_1_ =
         (long)local_2d8.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[3].first != -1;
    if ((bool)local_288[0].field_2._0_1_) {
      local_288[0]._M_dataplus._M_p =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[3].first;
      local_288[0]._M_string_length =
           (size_type)
           (local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[3].second);
    }
  }
  local_f8 = 0;
  _Stack_100._M_current = (char *)0x0;
  local_108._M_current = (char *)0x0;
  if ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1) {
    local_f8 = 1;
    local_108._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    _Stack_100._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second;
  }
LAB_0010a99f:
  b_01._17_7_ = uStack_f7;
  b_01.matched = (bool)local_f8;
  b_01.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = _Stack_100._M_current;
  b_01.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_108._M_current;
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,b_01);
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char_const*>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,"a");
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char_const*>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,"b");
  local_88._M_current = (char *)0x0;
  _Stack_80._M_current = (char *)0x0;
  local_78 = 0;
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_78 = 1;
    local_88._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    _Stack_80._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second;
  }
  b_02._17_7_ = uStack_77;
  b_02.matched = (bool)local_78;
  b_02.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = _Stack_80._M_current;
  b_02.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_88._M_current;
  check_less<char[1],booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((char (*) [1])0x117a80,b_02);
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a","");
  check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,std::__cxx11::string>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_288[0]._M_dataplus._M_p = (pointer)0x0;
  local_288[0]._M_string_length = 0;
  local_288[0].field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_288[0].field_2._M_local_buf[0] = '\x01';
    local_288[0]._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_288[0]._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"b","");
  check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,std::__cxx11::string>
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_288[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  local_a8._M_current = (char *)0x0;
  _Stack_a0._M_current = (char *)0x0;
  local_98 = 0;
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_98 = 1;
    local_a8._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    _Stack_a0._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second;
  }
  b_03._17_7_ = uStack_97;
  b_03.matched = (bool)local_98;
  b_03.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = _Stack_a0._M_current;
  b_03.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_a8._M_current;
  check_less<std::__cxx11::string,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (local_288,b_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  local_2f8._M_dataplus._M_p = (pointer)0x0;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = false;
  uVar7 = (uint)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar7 < 2) {
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_2a8.matched = false;
  }
  else {
    local_2f8.field_2._M_local_buf[0] =
         (long)local_2d8.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[1].first != -1;
    if ((bool)local_2f8.field_2._M_local_buf[0]) {
      local_2f8._M_dataplus._M_p =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].first;
      local_2f8._M_string_length =
           (size_type)
           (local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].second);
    }
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_2a8.matched = false;
    if ((4 < uVar7) &&
       ((long)local_2d8.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[4].first != -1)) {
      local_2a8.matched = true;
      local_2a8.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[4].first;
      local_2a8.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current =
           local_2d8.begin_._M_current +
           local_2d8.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[4].second;
    }
  }
  booster::operator+(local_288,
                     (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2f8,&local_2a8);
  iVar4 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[1]+cm[4]==\"ab\"",0x12);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2f8._M_dataplus._M_p = (pointer)0x0;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  if ((4 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[4].first != -1)) {
    local_2f8.field_2._M_local_buf[0] = '\x01';
    local_2f8._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].first;
    local_2f8._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].second);
  }
  booster::operator+(local_288,"a",
                     (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2f8);
  iVar4 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"a\"+cm[4]==\"ab\"",0x10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2f8._M_dataplus._M_p = (pointer)0x0;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_2f8.field_2._M_local_buf[0] = '\x01';
    local_2f8._M_dataplus._M_p =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_2f8._M_string_length =
         (size_type)
         (local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second);
  }
  booster::operator+(local_288,
                     (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2f8,"b");
  iVar4 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,0x62);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," cm[1]+\"b\"==\"ab\"",0x10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a","");
  local_2a8.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  local_2a8.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  local_2a8.matched = false;
  if ((4 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[4].first != -1)) {
    local_2a8.matched = true;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].first;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[4].second;
  }
  booster::operator+(local_288,&local_2f8,&local_2a8);
  iVar4 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,99);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," std::string(\"a\")+cm[4]==\"ab\"",0x1d);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2a8.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  local_2a8.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  local_2a8.matched = false;
  if ((1 < (int)((ulong)((long)local_2d8.offsets_.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     ((long)local_2d8.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[1].first != -1)) {
    local_2a8.matched = true;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].first;
    local_2a8.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current =
         local_2d8.begin_._M_current +
         local_2d8.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].second;
  }
  local_2f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"b","");
  booster::operator+(local_288,&local_2a8,&local_2f8);
  iVar4 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_288,100);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," cm[1]+std::string(\"b\")==\"ab\"",0x1d);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_2d8.offsets_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.offsets_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_match(Param str)
{
	MatchType cm;
	TEST(booster::regex_match(str,cm,booster::regex("(a)(a)(x)?(b)")));
	TEST(cm.size()==5);
	TEST(cm[0].matched && cm[1].matched && cm[1].matched && !cm[3].matched && cm[4].matched);

	TEST(cm[0]=="aab");
	TEST(cm[1]=="a");
	TEST(cm[2]=="a");
	TEST(cm[3]!="a");
	TEST(cm[3]=="");
	TEST(cm[4]=="b");

	check_equal(cm[1],cm[2]);
	check_less(cm[1],cm[4]);
	check_less(cm[3],cm[1]);

	check_equal(cm[1],"a");
	check_less(cm[1],"b");
	check_less("",cm[1]);

	check_equal(cm[1],std::string("a"));
	check_less(cm[1],std::string("b"));
	check_less(std::string(""),cm[1]);

	TEST(cm[1]+cm[4]=="ab");
	TEST("a"+cm[4]=="ab");
	TEST(cm[1]+"b"=="ab");
	TEST(std::string("a")+cm[4]=="ab");
	TEST(cm[1]+std::string("b")=="ab");
}